

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

NameType * __thiscall
(anonymous_namespace)::Db::make<(anonymous_namespace)::NameType,char_const(&)[9]>
          (Db *this,char (*args) [9])

{
  NameType *this_00;
  StringView local_28;
  char (*local_18) [9];
  char (*args_local) [9];
  Db *this_local;
  
  local_18 = args;
  args_local = (char (*) [9])this;
  this_00 = (NameType *)
            anon_unknown.dwarf_426d84::BumpPointerAllocator::allocate
                      ((BumpPointerAllocator *)(this + 0x2f0),0x20);
  StringView::StringView(&local_28,*local_18);
  anon_unknown.dwarf_426d84::NameType::NameType(this_00,local_28);
  return this_00;
}

Assistant:

T *make(Args &&... args) {
    return new (ASTAllocator.allocate(sizeof(T)))
        T(std::forward<Args>(args)...);
  }